

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DebugInfoManager::ClearDebugInfo(DebugInfoManager *this,Instruction *instr)

{
  iterator iVar1;
  bool bVar2;
  OpenCLDebugInfo100Instructions OVar3;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar4;
  CommonDebugInfoInstructions CVar5;
  uint32_t uVar6;
  DebugScope *this_00;
  pointer ppVar7;
  pointer ppVar8;
  IRContext *pIVar9;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  _Var10;
  Instruction *pIVar11;
  undefined1 local_a0 [8];
  undefined1 local_98 [8];
  inst_iterator dbg_instr_itr_2;
  undefined1 local_88 [8];
  inst_iterator dbg_instr_itr_1;
  undefined1 local_78 [4];
  uint32_t operation_const;
  undefined1 local_70 [8];
  inst_iterator dbg_instr_itr;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_60;
  iterator dbg_decl_itr;
  uint32_t var_or_value_id;
  uint32_t fn_id_1;
  uint32_t fn_id;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_38;
  iterator inlinedat_id_to_users_itr;
  uint32_t local_24;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  local_20;
  iterator scope_id_to_users_itr;
  Instruction *instr_local;
  DebugInfoManager *this_local;
  
  scope_id_to_users_itr.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
               )instr;
  this_00 = opt::Instruction::GetDebugScope(instr);
  local_24 = DebugScope::GetLexicalScope(this_00);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->scope_id_to_users_,&local_24);
  inlinedat_id_to_users_itr =
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::end(&this->scope_id_to_users_);
  bVar2 = std::__detail::operator!=
                    (&local_20,
                     &inlinedat_id_to_users_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                    );
  if (bVar2) {
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                           *)&local_20);
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::erase(&ppVar7->second,(key_type *)&scope_id_to_users_itr);
  }
  local_3c = opt::Instruction::GetDebugInlinedAt
                       ((Instruction *)
                        scope_id_to_users_itr.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                        ._M_cur);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
       ::find(&this->inlinedat_id_to_users_,&local_3c);
  _fn_id = (__node_type *)
           std::
           unordered_map<unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           ::end(&this->inlinedat_id_to_users_);
  bVar2 = std::__detail::operator!=
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      *)&fn_id);
  if (bVar2) {
    ppVar7 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                           *)&local_38);
    std::
    unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
    ::erase(&ppVar7->second,(key_type *)&scope_id_to_users_itr);
  }
  if ((scope_id_to_users_itr.
       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (bVar2 = opt::Instruction::IsCommonDebugInstr
                        ((Instruction *)
                         scope_id_to_users_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur), bVar2)) {
    fn_id_1 = opt::Instruction::result_id
                        ((Instruction *)
                         scope_id_to_users_itr.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                         ._M_cur);
    std::
    unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
    ::erase(&this->id_to_dbg_inst_,&fn_id_1);
    OVar3 = opt::Instruction::GetOpenCL100DebugOpcode
                      ((Instruction *)
                       scope_id_to_users_itr.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                       ._M_cur);
    if (OVar3 == OpenCLDebugInfo100DebugFunction) {
      var_or_value_id =
           opt::Instruction::GetSingleWordOperand
                     ((Instruction *)
                      scope_id_to_users_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      ._M_cur,0xd);
      std::
      unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
      ::erase(&this->fn_id_to_dbg_fn_,&var_or_value_id);
    }
    NVar4 = opt::Instruction::GetShader100DebugOpcode
                      ((Instruction *)
                       scope_id_to_users_itr.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                       ._M_cur);
    if (NVar4 == NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      dbg_decl_itr.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur._4_4_ =
           opt::Instruction::GetSingleWordOperand
                     ((Instruction *)
                      scope_id_to_users_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      ._M_cur,5);
      std::
      unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
      ::erase(&this->fn_id_to_dbg_fn_,
              (key_type *)
              ((long)&dbg_decl_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      ._M_cur + 4));
    }
    CVar5 = opt::Instruction::GetCommonDebugOpcode
                      ((Instruction *)
                       scope_id_to_users_itr.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                       ._M_cur);
    if ((CVar5 == CommonDebugInfoDebugDeclare) ||
       (CVar5 = opt::Instruction::GetCommonDebugOpcode
                          ((Instruction *)
                           scope_id_to_users_itr.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                           ._M_cur), CVar5 == CommonDebugInfoDebugValue)) {
      dbg_decl_itr.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
      ._M_cur._0_4_ =
           opt::Instruction::GetSingleWordOperand
                     ((Instruction *)
                      scope_id_to_users_itr.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                      ._M_cur,5);
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           ::find(&this->var_id_to_dbg_decl_,(key_type *)&dbg_decl_itr);
      dbg_instr_itr.super_iterator.node_ =
           (iterator)
           std::
           unordered_map<unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>_>
           ::end(&this->var_id_to_dbg_decl_);
      bVar2 = std::__detail::operator!=
                        (&local_60,
                         (_Node_iterator_base<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                          *)&dbg_instr_itr);
      if (bVar2) {
        ppVar8 = std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                 ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false,_false>
                               *)&local_60);
        std::
        set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>
        ::erase(&ppVar8->second,(key_type *)&scope_id_to_users_itr);
      }
    }
    if ((__node_type *)this->deref_operation_ ==
        scope_id_to_users_itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
        ._M_cur) {
      this->deref_operation_ = (Instruction *)0x0;
      pIVar9 = context(this);
      IRContext::module(pIVar9);
      Module::ext_inst_debuginfo_begin((Module *)local_70);
      while( true ) {
        pIVar9 = context(this);
        IRContext::module(pIVar9);
        Module::ext_inst_debuginfo_end((Module *)local_78);
        bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_70,
                                  (iterator_template<spvtools::opt::Instruction> *)local_78);
        iVar1 = scope_id_to_users_itr;
        if (!bVar2) break;
        _Var10._M_cur =
             (__node_type *)
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_70);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur !=
            (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )_Var10._M_cur) {
          pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator->
                              ((iterator_template<spvtools::opt::Instruction> *)local_70);
          OVar3 = opt::Instruction::GetOpenCL100DebugOpcode(pIVar11);
          if (OVar3 == OpenCLDebugInfo100DebugOperation) {
            pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator->
                                ((iterator_template<spvtools::opt::Instruction> *)local_70);
            uVar6 = opt::Instruction::GetSingleWordOperand(pIVar11,4);
            if (uVar6 == 0) {
              pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                        iterator_template<spvtools::opt::Instruction>::operator*
                                  ((iterator_template<spvtools::opt::Instruction> *)local_70);
              this->deref_operation_ = pIVar11;
              break;
            }
          }
        }
        iVar1.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
        ._M_cur = scope_id_to_users_itr.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
                  ._M_cur;
        _Var10._M_cur =
             (__node_type *)
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_70);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur !=
            (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )_Var10._M_cur) {
          pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator->
                              ((iterator_template<spvtools::opt::Instruction> *)local_70);
          NVar4 = opt::Instruction::GetShader100DebugOpcode(pIVar11);
          if (NVar4 == NonSemanticShaderDebugInfo100DebugOperation) {
            pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                ((iterator_template<spvtools::opt::Instruction> *)local_70);
            dbg_instr_itr_1.super_iterator.node_._4_4_ = GetVulkanDebugOperation(this,pIVar11);
            if (dbg_instr_itr_1.super_iterator.node_._4_4_ == 0) {
              pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                        iterator_template<spvtools::opt::Instruction>::operator*
                                  ((iterator_template<spvtools::opt::Instruction> *)local_70);
              this->deref_operation_ = pIVar11;
              break;
            }
          }
        }
        InstructionList::iterator::operator++((iterator *)local_70);
      }
    }
    if ((__node_type *)this->debug_info_none_inst_ ==
        scope_id_to_users_itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
        ._M_cur) {
      this->debug_info_none_inst_ = (Instruction *)0x0;
      pIVar9 = context(this);
      IRContext::module(pIVar9);
      Module::ext_inst_debuginfo_begin((Module *)local_88);
      while( true ) {
        pIVar9 = context(this);
        IRContext::module(pIVar9);
        Module::ext_inst_debuginfo_end((Module *)&dbg_instr_itr_2);
        bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_88,
                                  &dbg_instr_itr_2.super_iterator);
        iVar1 = scope_id_to_users_itr;
        if (!bVar2) break;
        _Var10._M_cur =
             (__node_type *)
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_88);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur !=
            (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )_Var10._M_cur) {
          pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator->
                              ((iterator_template<spvtools::opt::Instruction> *)local_88);
          CVar5 = opt::Instruction::GetCommonDebugOpcode(pIVar11);
          if (CVar5 == CommonDebugInfoDebugInfoNone) {
            pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                ((iterator_template<spvtools::opt::Instruction> *)local_88);
            this->debug_info_none_inst_ = pIVar11;
            break;
          }
        }
        InstructionList::iterator::operator++((iterator *)local_88);
      }
    }
    if ((__node_type *)this->empty_debug_expr_inst_ ==
        scope_id_to_users_itr.
        super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
        ._M_cur) {
      this->empty_debug_expr_inst_ = (Instruction *)0x0;
      pIVar9 = context(this);
      IRContext::module(pIVar9);
      Module::ext_inst_debuginfo_begin((Module *)local_98);
      while( true ) {
        pIVar9 = context(this);
        IRContext::module(pIVar9);
        Module::ext_inst_debuginfo_end((Module *)local_a0);
        bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_98,
                                  (iterator_template<spvtools::opt::Instruction> *)local_a0);
        iVar1 = scope_id_to_users_itr;
        if (!bVar2) break;
        _Var10._M_cur =
             (__node_type *)
             utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_98);
        if (iVar1.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
            ._M_cur !=
            (_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>_>,_false>
             )_Var10._M_cur) {
          pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                    iterator_template<spvtools::opt::Instruction>::operator*
                              ((iterator_template<spvtools::opt::Instruction> *)local_98);
          bVar2 = anon_unknown_0::IsEmptyDebugExpression(pIVar11);
          if (bVar2) {
            pIVar11 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                ((iterator_template<spvtools::opt::Instruction> *)local_98);
            this->empty_debug_expr_inst_ = pIVar11;
            return;
          }
        }
        InstructionList::iterator::operator++((iterator *)local_98);
      }
    }
  }
  return;
}

Assistant:

void DebugInfoManager::ClearDebugInfo(Instruction* instr) {
  auto scope_id_to_users_itr =
      scope_id_to_users_.find(instr->GetDebugScope().GetLexicalScope());
  if (scope_id_to_users_itr != scope_id_to_users_.end()) {
    scope_id_to_users_itr->second.erase(instr);
  }
  auto inlinedat_id_to_users_itr =
      inlinedat_id_to_users_.find(instr->GetDebugInlinedAt());
  if (inlinedat_id_to_users_itr != inlinedat_id_to_users_.end()) {
    inlinedat_id_to_users_itr->second.erase(instr);
  }

  if (instr == nullptr || !instr->IsCommonDebugInstr()) {
    return;
  }

  id_to_dbg_inst_.erase(instr->result_id());

  if (instr->GetOpenCL100DebugOpcode() == OpenCLDebugInfo100DebugFunction) {
    auto fn_id =
        instr->GetSingleWordOperand(kDebugFunctionOperandFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }
  if (instr->GetShader100DebugOpcode() ==
      NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
    auto fn_id = instr->GetSingleWordOperand(
        kDebugFunctionDefinitionOperandOpFunctionIndex);
    fn_id_to_dbg_fn_.erase(fn_id);
  }

  if (instr->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
      instr->GetCommonDebugOpcode() == CommonDebugInfoDebugValue) {
    auto var_or_value_id =
        instr->GetSingleWordOperand(kDebugDeclareOperandVariableIndex);
    auto dbg_decl_itr = var_id_to_dbg_decl_.find(var_or_value_id);
    if (dbg_decl_itr != var_id_to_dbg_decl_.end()) {
      dbg_decl_itr->second.erase(instr);
    }
  }

  if (deref_operation_ == instr) {
    deref_operation_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      // OpenCL.DebugInfo.100 contains the operation as a literal operand, in
      // Vulkan it's referenced as an OpConstant.
      if (instr != &*dbg_instr_itr &&
          dbg_instr_itr->GetOpenCL100DebugOpcode() ==
              OpenCLDebugInfo100DebugOperation &&
          dbg_instr_itr->GetSingleWordOperand(
              kDebugOperationOperandOperationIndex) ==
              OpenCLDebugInfo100Deref) {
        deref_operation_ = &*dbg_instr_itr;
        break;
      } else if (instr != &*dbg_instr_itr &&
                 dbg_instr_itr->GetShader100DebugOpcode() ==
                     NonSemanticShaderDebugInfo100DebugOperation) {
        uint32_t operation_const = GetVulkanDebugOperation(&*dbg_instr_itr);
        if (operation_const == NonSemanticShaderDebugInfo100Deref) {
          deref_operation_ = &*dbg_instr_itr;
          break;
        }
      }
    }
  }

  if (debug_info_none_inst_ == instr) {
    debug_info_none_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && dbg_instr_itr->GetCommonDebugOpcode() ==
                                          CommonDebugInfoDebugInfoNone) {
        debug_info_none_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }

  if (empty_debug_expr_inst_ == instr) {
    empty_debug_expr_inst_ = nullptr;
    for (auto dbg_instr_itr = context()->module()->ext_inst_debuginfo_begin();
         dbg_instr_itr != context()->module()->ext_inst_debuginfo_end();
         ++dbg_instr_itr) {
      if (instr != &*dbg_instr_itr && IsEmptyDebugExpression(&*dbg_instr_itr)) {
        empty_debug_expr_inst_ = &*dbg_instr_itr;
        break;
      }
    }
  }
}